

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

UnknownFieldSet * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetUnknownFields
          (GeneratedMessageReflection *this,Message *message)

{
  ulong uVar1;
  UnknownFieldSet *pUVar2;
  FunctionClosure0 local_20;
  
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3) {
    pUVar2 = (anonymous_namespace)::empty_unknown_field_set_;
    if ((anonymous_namespace)::empty_unknown_field_set_once_ != 2) {
      local_20.super_Closure._vptr_Closure = (_func_int **)&PTR__FunctionClosure0_0042b198;
      local_20.function_ = anon_unknown_0::InitEmptyUnknownFieldSet;
      local_20.self_deleting_ = false;
      GoogleOnceInitImpl(&(anonymous_namespace)::empty_unknown_field_set_once_,
                         &local_20.super_Closure);
      FunctionClosure0::~FunctionClosure0(&local_20);
      pUVar2 = (anonymous_namespace)::empty_unknown_field_set_;
    }
  }
  else {
    uVar1 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                      (ulong)(uint)(this->schema_).metadata_offset_);
    if ((uVar1 & 1) == 0) {
      pUVar2 = UnknownFieldSet::default_instance();
      return pUVar2;
    }
    pUVar2 = (UnknownFieldSet *)(uVar1 & 0xfffffffffffffffe);
  }
  return pUVar2;
}

Assistant:

const UnknownFieldSet& GeneratedMessageReflection::GetUnknownFields(
    const Message& message) const {
  if (descriptor_->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
    // We have to ensure that any mutations made to the return value of
    // MutableUnknownFields() are not reflected here.
    return GetEmptyUnknownFieldSet();
  } else {
    return GetInternalMetadataWithArena(message).unknown_fields();
  }
}